

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qconcatenatetablesproxymodel.cpp
# Opt level: O2

void __thiscall
QConcatenateTablesProxyModelPrivate::slotColumnsMoved
          (QConcatenateTablesProxyModelPrivate *this,QModelIndex *sourceParent,int sourceStart,
          int sourceEnd,QModelIndex *destinationParent,int destination)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QPersistentModelIndex> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QModelIndex::isValid(sourceParent);
  if (!bVar1) {
    bVar1 = QModelIndex::isValid(destinationParent);
    if (!bVar1) {
      local_38.d = (Data *)0x0;
      local_38.ptr = (QPersistentModelIndex *)0x0;
      local_38.size = 0;
      slotSourceLayoutChanged(this,(QList<QPersistentModelIndex> *)&local_38,HorizontalSortHint);
      QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QConcatenateTablesProxyModelPrivate::slotColumnsMoved(const QModelIndex &sourceParent,
                                                           int sourceStart, int sourceEnd,
                                                           const QModelIndex &destinationParent,
                                                           int destination)
{
    Q_UNUSED(sourceStart)
    Q_UNUSED(sourceEnd)
    Q_UNUSED(destination)
    if (sourceParent.isValid() || destinationParent.isValid())
        return;
    slotSourceLayoutChanged({}, QAbstractItemModel::HorizontalSortHint);
}